

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O2

void envy_bios_print_power_cstep(envy_bios *bios,FILE *out,uint mask)

{
  uint uVar1;
  envy_bios_power_cstep_entry2 *peVar2;
  undefined8 in_RAX;
  long lVar3;
  ulong uVar4;
  
  uVar1 = (bios->power).cstep.offset;
  if ((mask >> 10 & 1) == 0 || uVar1 == 0) {
    return;
  }
  uVar4 = (ulong)(bios->power).cstep.version;
  if ((bios->power).cstep.valid != '\0') {
    fprintf((FILE *)out,"CSTEP table at 0x%x, version %x\n",(ulong)uVar1,uVar4);
    envy_bios_dump_hex(bios,out,(bios->power).cstep.offset,(uint)(bios->power).cstep.hlen,mask);
    if ((int)mask < 0) {
      fputc(10,(FILE *)out);
    }
    for (uVar4 = 0; uVar4 < (bios->power).cstep.entriesnum; uVar4 = uVar4 + 1) {
      fprintf((FILE *)out,"\t%i: pstate %x index %d\n",uVar4 & 0xffffffff,
              (ulong)(bios->power).cstep.ent1[uVar4].pstate,
              (ulong)(bios->power).cstep.ent1[uVar4].index);
      envy_bios_dump_hex(bios,out,(bios->power).cstep.ent1[uVar4].offset,
                         (uint)(bios->power).cstep.rlen,mask);
      if ((int)mask < 0) {
        fputc(10,(FILE *)out);
      }
    }
    fwrite("---\n",4,1,(FILE *)out);
    lVar3 = 0;
    for (uVar4 = 0; uVar4 < (bios->power).cstep.snr; uVar4 = uVar4 + 1) {
      peVar2 = (bios->power).cstep.ent2;
      if (peVar2->unkn[lVar3 + -4] != '\0') {
        in_RAX = CONCAT44((int)((ulong)in_RAX >> 0x20),(uint)peVar2->unkn[lVar3 + 2]);
        fprintf((FILE *)out,"\t%i: freq %d MHz unkn[0] %x unkn[1] %x voltage %d\n",
                uVar4 & 0xffffffff,(ulong)*(ushort *)(peVar2->unkn + lVar3 + -2),
                (ulong)peVar2->unkn[lVar3],(ulong)peVar2->unkn[lVar3 + 1],in_RAX);
        envy_bios_dump_hex(bios,out,*(uint *)(((bios->power).cstep.ent2)->unkn + lVar3 + -8),
                           (uint)(bios->power).cstep.ssz,mask);
        if ((int)mask < 0) {
          fputc(10,(FILE *)out);
        }
      }
      lVar3 = lVar3 + 0xc;
    }
    fputc(10,(FILE *)out);
    return;
  }
  fprintf((FILE *)out,"Failed to parse CSTEP table at 0x%x, version %x\n",(ulong)uVar1,uVar4);
  return;
}

Assistant:

void envy_bios_print_power_cstep(struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_power_cstep *cstep = &bios->power.cstep;
	int i;

	if (!cstep->offset || !(mask & ENVY_BIOS_PRINT_PERF))
		return;
	if (!cstep->valid) {
		fprintf(out, "Failed to parse CSTEP table at 0x%x, version %x\n", cstep->offset, cstep->version);
		return;
	}

	fprintf(out, "CSTEP table at 0x%x, version %x\n", cstep->offset, cstep->version);
	envy_bios_dump_hex(bios, out, cstep->offset, cstep->hlen, mask);
	if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");

	for (i = 0; i < cstep->entriesnum; i++) {
		fprintf(out, "	%i: pstate %x index %d\n", i,
			cstep->ent1[i].pstate, cstep->ent1[i].index);
		envy_bios_dump_hex(bios, out, cstep->ent1[i].offset, cstep->rlen, mask);
		if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");
	}
	fprintf(out, "---\n");
	for (i = 0; i < cstep->snr; i++) {
		if (!cstep->ent2[i].valid)
			continue;

		fprintf(out, "	%i: freq %d MHz unkn[0] %x unkn[1] %x voltage %d\n",
			i, cstep->ent2[i].freq, cstep->ent2[i].unkn[0], cstep->ent2[i].unkn[1], cstep->ent2[i].voltage);
		envy_bios_dump_hex(bios, out, cstep->ent2[i].offset, cstep->ssz, mask);
		if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");
	}

	fprintf(out, "\n");
}